

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O3

void __thiscall
TPZMHMixedMeshControl::HybridizeSkeleton
          (TPZMHMixedMeshControl *this,int skeletonmatid,int pressurematid)

{
  _Rb_tree_header *p_Var1;
  TPZCompMesh *pTVar2;
  int iVar3;
  TPZGeoEl **ppTVar4;
  undefined8 uVar5;
  _Rb_tree_node_base *p_Var6;
  TPZCompEl *pTVar7;
  TPZCompEl *pTVar8;
  long lVar9;
  long lVar10;
  int64_t iVar11;
  _List_node_base *p_Var12;
  TPZInterpolatedElement *this_00;
  TPZConnect *pTVar13;
  TPZGeoEl *pTVar14;
  _Self __tmp;
  _List_node_base *p_Var15;
  int iVar16;
  _Self __tmp_1;
  TPZGeoElBC pressuregel;
  TPZGeoElBC skeleton2;
  TPZStack<TPZInterpolatedElement_*,_10> pressure;
  TPZGeoElSide gelside;
  TPZStack<TPZInterpolatedElement_*,_10> fluxorig;
  TPZStack<TPZInterpolatedElement_*,_10> fluxsecond;
  TPZGeoElBC local_1e0;
  TPZGeoElBC local_1d8;
  undefined **local_1d0;
  undefined1 *local_1c8;
  long local_1c0;
  undefined8 uStack_1b8;
  undefined1 local_1b0 [80];
  undefined1 local_160 [8];
  _Rb_tree_node_base local_158;
  size_t local_138;
  _Rb_tree_node_base *local_130;
  _Base_ptr *local_128;
  long local_120;
  _Base_ptr *local_118;
  undefined **local_110;
  undefined1 *local_108;
  long local_100;
  undefined8 uStack_f8;
  undefined1 local_f0 [80];
  undefined **local_a0;
  undefined1 *local_98;
  long local_90;
  undefined8 uStack_88;
  undefined1 local_80 [80];
  
  TPZGeoMesh::ResetReference(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer);
  local_108 = local_f0;
  local_100 = 0;
  uStack_f8 = 0;
  local_110 = &PTR__TPZManVector_019e1850;
  local_98 = local_80;
  local_90 = 0;
  uStack_88 = 0;
  local_a0 = &PTR__TPZManVector_019e1850;
  local_1c8 = local_1b0;
  local_1c0 = 0;
  uStack_1b8 = 0;
  local_1d0 = &PTR__TPZManVector_019e1850;
  TPZCompMesh::LoadReferences(((this->fFluxMesh).fRef)->fPointer);
  p_Var6 = (this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_left;
  p_Var1 = &(this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,*(int64_t *)(p_Var6 + 1));
      if ((*(_Base_ptr *)(p_Var6 + 1) != p_Var6[1]._M_left) &&
         (pTVar14 = *ppTVar4, pTVar14->fMatId == skeletonmatid)) {
        (**(code **)(*(long *)pTVar14 + 0xf0))(pTVar14);
        if (pTVar14->fReference == (TPZCompEl *)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = __dynamic_cast(pTVar14->fReference,&TPZCompEl::typeinfo,
                                 &TPZInterpolatedElement::typeinfo,0);
        }
        (*(code *)local_110[3])(&local_110,local_100 + 1);
        *(undefined8 *)(local_108 + local_100 * 8 + -8) = uVar5;
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  TPZGeoMesh::ResetReference(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer);
  ((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer->fDefaultOrder =
       (this->super_TPZMHMeshControl).fpOrderSkeleton;
  for (p_Var6 = (this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left; (_Rb_tree_header *)p_Var6 != p_Var1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        (&(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
                          super_TPZChunkVector<TPZGeoEl_*,_10>,*(int64_t *)(p_Var6 + 1));
    if ((*(_Base_ptr *)(p_Var6 + 1) != p_Var6[1]._M_left) &&
       (pTVar14 = *ppTVar4, pTVar14->fMatId == skeletonmatid)) {
      iVar3 = (**(code **)(*(long *)pTVar14 + 0xf0))(pTVar14);
      local_160 = (undefined1  [8])&PTR__TPZGeoElSide_018f8760;
      local_158._M_parent = (_Base_ptr)CONCAT44(local_158._M_parent._4_4_,iVar3 + -1);
      local_158._0_8_ = pTVar14;
      TPZGeoElBC::TPZGeoElBC
                (&local_1d8,(TPZGeoElSide *)local_160,
                 (this->super_TPZMHMeshControl).fSecondSkeletonMatId);
      pTVar2 = ((this->fFluxMesh).fRef)->fPointer;
      TPZCreateApproximationSpace::SetAllCreateFunctionsHDiv(&pTVar2->fCreate,pTVar2->fDimModel);
      pTVar2 = ((this->fFluxMesh).fRef)->fPointer;
      pTVar7 = TPZCreateApproximationSpace::CreateCompEl
                         (&pTVar2->fCreate,local_1d8.fCreatedElement,pTVar2);
      if (pTVar7 == (TPZCompEl *)0x0) {
        pTVar7 = (TPZCompEl *)0x0;
      }
      else {
        pTVar7 = (TPZCompEl *)
                 __dynamic_cast(pTVar7,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
      }
      TPZMHMeshControl::SetSubdomain(&this->super_TPZMHMeshControl,pTVar7,-1);
      (**(code **)(*(long *)pTVar7 + 0x2f8))(pTVar7,iVar3 + -1,1);
      (local_1d8.fCreatedElement)->fReference = (TPZCompEl *)0x0;
      TPZGeoElBC::TPZGeoElBC(&local_1e0,(TPZGeoElSide *)local_160,pressurematid);
      TPZCreateApproximationSpace::SetAllCreateFunctionsContinuous
                (&((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer->fCreate);
      pTVar2 = ((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer;
      pTVar8 = TPZCreateApproximationSpace::CreateCompEl
                         (&pTVar2->fCreate,local_1e0.fCreatedElement,pTVar2);
      if (pTVar8 == (TPZCompEl *)0x0) {
        pTVar8 = (TPZCompEl *)0x0;
      }
      else {
        pTVar8 = (TPZCompEl *)
                 __dynamic_cast(pTVar8,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
      }
      TPZMHMeshControl::SetSubdomain(&this->super_TPZMHMeshControl,pTVar8,-1);
      iVar3 = (**(code **)(*(long *)pTVar8 + 0x90))(pTVar8);
      if (0 < iVar3) {
        iVar16 = 0;
        do {
          lVar9 = (**(code **)(*(long *)pTVar8 + 0xa8))(pTVar8,iVar16);
          *(undefined1 *)(lVar9 + 0x16) = 3;
          iVar16 = iVar16 + 1;
        } while (iVar3 != iVar16);
      }
      (local_1e0.fCreatedElement)->fReference = (TPZCompEl *)0x0;
      (*(code *)local_a0[3])(&local_a0,local_90 + 1);
      *(TPZCompEl **)(local_98 + local_90 * 8 + -8) = pTVar7;
      (*(code *)local_1d0[3])(&local_1d0,local_1c0 + 1);
      *(TPZCompEl **)(local_1c8 + local_1c0 * 8 + -8) = pTVar8;
    }
  }
  TPZCompMesh::LoadReferences(((this->fFluxMesh).fRef)->fPointer);
  p_Var6 = (this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_left;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    lVar9 = 0;
    do {
      ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,*(int64_t *)(p_Var6 + 1));
      if ((*(_Base_ptr *)(p_Var6 + 1) != p_Var6[1]._M_left) && ((*ppTVar4)->fMatId == skeletonmatid)
         ) {
        pTVar7 = (*ppTVar4)->fReference;
        if ((pTVar7 == (TPZCompEl *)0x0) || (pTVar7 != *(TPZCompEl **)(local_108 + lVar9 * 8))) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                     ,899);
        }
        local_158._0_8_ = local_158._0_8_ & 0xffffffff00000000;
        local_158._M_parent = (_Base_ptr)0x0;
        local_158._M_left = &local_158;
        local_138 = 0;
        local_158._M_right = local_158._M_left;
        TPZMHMeshControl::ConnectedElements
                  (&this->super_TPZMHMeshControl,(int64_t)*(_Base_ptr *)(p_Var6 + 1),
                   (pair<long,_long> *)&p_Var6[1]._M_parent,
                   (map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                    *)local_160);
        if (local_138 != 2) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                     ,0x389);
        }
        lVar10 = (**(code **)(**(long **)(local_108 + lVar9 * 8) + 0xa0))
                           (*(long **)(local_108 + lVar9 * 8),0);
        iVar11 = (**(code **)(**(long **)(local_98 + lVar9 * 8) + 0xa0))
                           (*(long **)(local_98 + lVar9 * 8),0);
        local_128 = &p_Var6[1]._M_left;
        local_130 = p_Var6;
        local_118 = &p_Var6[1]._M_parent;
        p_Var12 = (_List_node_base *)
                  std::
                  map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                  ::operator[]((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                                *)local_160,(key_type_conflict1 *)local_128);
        p_Var15 = p_Var12;
        local_120 = lVar9;
        while (lVar9 = local_120,
              p_Var15 = (((_List_base<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)
                         &p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var15 != p_Var12) {
          iVar3 = *(int *)&p_Var15[1]._M_prev;
          this_00 = (TPZInterpolatedElement *)
                    __dynamic_cast(p_Var15[1]._M_next,&TPZCompEl::typeinfo,
                                   &TPZInterpolatedElement::typeinfo,0);
          iVar16 = (**(code **)(*(long *)&(this_00->super_TPZInterpolationSpace).super_TPZCompEl +
                               0x248))(this_00);
          if (iVar16 != 1) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                       ,0x394);
          }
          pTVar13 = TPZInterpolatedElement::SideConnect(this_00,0,iVar3);
          if (pTVar13->fDependList->fDepConnectIndex != lVar10) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                       ,0x39a);
          }
          pTVar13->fDependList->fDepConnectIndex = iVar11;
          (**(code **)(*(long *)&(this_00->super_TPZInterpolationSpace).super_TPZCompEl + 0x2f8))
                    (this_00,iVar3,1);
        }
        TPZMHMeshControl::SetSubdomain
                  (&this->super_TPZMHMeshControl,*(TPZCompEl **)(local_108 + local_120 * 8),
                   (int64_t)*local_118);
        TPZMHMeshControl::SetSubdomain
                  (&this->super_TPZMHMeshControl,*(TPZCompEl **)(local_98 + lVar9 * 8),
                   (int64_t)*local_128);
        lVar9 = lVar9 + 1;
        std::
        _Rb_tree<long,_std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<long,_std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                     *)local_160);
        p_Var6 = local_130;
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  TPZGeoMesh::ResetReference(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer);
  lVar9 = local_100;
  if (0 < local_100) {
    lVar10 = 0;
    do {
      pTVar14 = TPZCompEl::Reference(*(TPZCompEl **)(local_108 + lVar10 * 8));
      iVar11 = pTVar14->fIndex;
      pTVar14 = TPZCompEl::Reference(*(TPZCompEl **)(local_108 + lVar10 * 8));
      iVar3 = pTVar14->fMatId;
      pTVar14 = TPZCompEl::Reference(*(TPZCompEl **)(local_1c8 + lVar10 * 8));
      iVar16 = pTVar14->fMatId;
      pTVar14 = TPZCompEl::Reference(*(TPZCompEl **)(local_1c8 + lVar10 * 8));
      pTVar7 = *(TPZCompEl **)(local_108 + lVar10 * 8);
      pTVar7->fReferenceIndex = pTVar14->fIndex;
      *(int64_t *)(*(long *)(local_1c8 + lVar10 * 8) + 0x18) = iVar11;
      pTVar14 = TPZCompEl::Reference(pTVar7);
      SetAllMatid(pTVar14,iVar3);
      pTVar14 = TPZCompEl::Reference(*(TPZCompEl **)(local_1c8 + lVar10 * 8));
      SetAllMatid(pTVar14,iVar16);
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  (**(code **)(*(long *)((this->fFluxMesh).fRef)->fPointer + 0x60))();
  (**(code **)(*(long *)((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer + 0x60))()
  ;
  if (local_1c8 != local_1b0) {
    uStack_1b8 = 0;
    local_1d0 = &PTR__TPZVec_019e0d10;
    if (local_1c8 != (undefined1 *)0x0) {
      operator_delete__(local_1c8);
    }
  }
  if (local_98 != local_80) {
    uStack_88 = 0;
    local_a0 = &PTR__TPZVec_019e0d10;
    if (local_98 != (undefined1 *)0x0) {
      operator_delete__(local_98);
    }
  }
  if (local_108 != local_f0) {
    uStack_f8 = 0;
    local_110 = &PTR__TPZVec_019e0d10;
    if (local_108 != (undefined1 *)0x0) {
      operator_delete__(local_108);
    }
  }
  return;
}

Assistant:

void TPZMHMixedMeshControl::HybridizeSkeleton(int skeletonmatid, int pressurematid)
{

    fGMesh->ResetReference();
    int64_t nskel = fInterfaces.size();
    std::map<int64_t, std::pair<int64_t, int64_t> >::iterator it;
    TPZStack<TPZInterpolatedElement*> fluxorig;
    TPZStack<TPZInterpolatedElement *> fluxsecond;
    TPZStack<TPZInterpolatedElement *> pressure;

    fFluxMesh->LoadReferences();
    // build the fluxorig datastructure : contains the original flux elements
    // loop over the skeleton elements
    for (it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
        TPZGeoEl *gel = fGMesh->Element(it->first);
        // skip the boundary elements
        if (it->first == it->second.second) {
            continue;
        }
        if (gel->MaterialId() != skeletonmatid) {
            continue;
        }
        int side = gel->NSides()-1;
        TPZInterpolatedElement *orig = dynamic_cast<TPZInterpolatedElement *>(gel->Reference());
        fluxorig.Push(orig);
    }
    fGMesh->ResetReference();
    
    fPressureFineMesh->SetDefaultOrder(fpOrderSkeleton);
    // first create a second flux element and a pressure element on top of the existing skeleton element
    // loop over the skeleton elements
    for (it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
        TPZGeoEl *gel = fGMesh->Element(it->first);
        // skip the boundary elements
        if (it->first == it->second.second) {
            continue;
        }
        if (gel->MaterialId() != skeletonmatid) {
            continue;
        }
        int side = gel->NSides()-1;
        TPZGeoElSide gelside(gel,side);
        TPZGeoElBC skeleton2(gelside,fSecondSkeletonMatId);
        fFluxMesh->SetAllCreateFunctionsHDiv();
        // create a flux boundary element
        TPZCompEl* celflux = fFluxMesh->CreateCompEl(skeleton2.CreatedElement());
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(celflux);
        SetSubdomain(intel, -1);
#ifdef PZDEBUG
        if (intel->NConnects() != 1) {
            DebugStop();
        }
#endif
        // the side orientation of the boundary fluxes is +1 - we will need to fix the elements as well!
        if (it->second.first < it->second.second) {
            // totototo
            intel->SetSideOrient(side, 1);
        }
        else
        {
            intel->SetSideOrient(side, 1);
        }
        skeleton2.CreatedElement()->ResetReference();
        
        // create a dim-1 dimensional pressure element
        TPZGeoElBC pressuregel(gelside,pressurematid);
        // this will be changed to the pressure mesh
//        fFluxMesh->SetAllCreateFunctionsContinuous();
        fPressureFineMesh->SetAllCreateFunctionsContinuous();
//        fFluxMesh->CreateCompEl(pressuregel.CreatedElement(), indexpressure);
        TPZCompEl* celpressure = fPressureFineMesh->CreateCompEl(pressuregel.CreatedElement());
        TPZInterpolatedElement *presel = dynamic_cast<TPZInterpolatedElement *>(celpressure);
        SetSubdomain(presel, -1);
        // set the lagrange multiplier to the highest level
        int nc = presel->NConnects();
        for (int ic=0; ic<nc; ic++) {
            TPZConnect &c = presel->Connect(ic);
            c.SetLagrangeMultiplier(3);
        }
        // This can only be done after all flux connects have been created!!!
//        SetSubdomain(presel, -1);
        pressuregel.CreatedElement()->ResetReference();
        fluxsecond.Push(intel);
        pressure.Push(presel);
    }
    fFluxMesh->LoadReferences();
    
    // switch the connect dependency around AND fix the side orientation
    int64_t count = 0;
    for (it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
        TPZGeoEl *gel = fGMesh->Element(it->first);
        // skip the boundary elements
        if (it->first == it->second.second) {
            continue;
        }
        if (gel->MaterialId() != skeletonmatid) {
            continue;
        }
        TPZCompEl *cel = gel->Reference();
        if (!cel || cel != fluxorig[count]) {
            DebugStop();
        }
        std::map<int64_t,std::list<TPZCompElSide> > connectedmap;
        // connected elements will compute all the subelements of the skeleton element to left and right
        ConnectedElements(it->first, it->second, connectedmap);
        if (connectedmap.size() != 2) {
            DebugStop();
        }
        // identify the domains left and right of the skeleton element
        int64_t origdepindex = fluxorig[count]->ConnectIndex(0);
        int64_t newdepindex = fluxsecond[count]->ConnectIndex(0);
        std::list<TPZCompElSide> &updatelist = connectedmap[it->second.second];
        for (std::list<TPZCompElSide>::iterator itlist = updatelist.begin(); itlist != updatelist.end(); itlist++)
        {
            TPZCompElSide smallCompElSide = *itlist;
            TPZInterpolatedElement *smallel = dynamic_cast<TPZInterpolatedElement *>(smallCompElSide.Element());
            if (smallel->NSideConnects(smallCompElSide.Side()) != 1) {
                DebugStop();
            }
            TPZConnect &c = smallel->SideConnect(0, smallCompElSide.Side());
            TPZConnect::TPZDepend *dep = c.FirstDepend();
            if(dep->fDepConnectIndex != origdepindex)
            {
                DebugStop();
            }
            dep->fDepConnectIndex = newdepindex;
            // Set the side orientation to +1
            smallel->SetSideOrient(smallCompElSide.Side(), 1);
        }
        SetSubdomain(fluxorig[count],it->second.first);
        SetSubdomain(fluxsecond[count], it->second.second);
        count++;
    }
    fGMesh->ResetReference();
    // switch the reference index of the original flux element and the pressure element
    int64_t numflux = fluxorig.size();
    for (int iflux=0; iflux<numflux; iflux++) {
        int64_t fluxgelindex = fluxorig[iflux]->Reference()->Index();
        int fluxmat = fluxorig[iflux]->Reference()->MaterialId();
        int pressmat = pressure[iflux]->Reference()->MaterialId();
        int64_t pressuregelindex = pressure[iflux]->Reference()->Index();
        fluxorig[iflux]->SetReference(pressuregelindex);
        pressure[iflux]->SetReference(fluxgelindex);
        SetAllMatid(fluxorig[iflux]->Reference(), fluxmat);
        SetAllMatid(pressure[iflux]->Reference(), pressmat);
    }

    // The connects of the pressure mesh are not to be condensed
    fFluxMesh->ExpandSolution();
    fPressureFineMesh->ExpandSolution();

}